

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpAggregator.cpp
# Opt level: O3

void __thiscall
HighsLpAggregator::getCurrentAggregation
          (HighsLpAggregator *this,vector<int,_std::allocator<int>_> *inds,
          vector<double,_std::allocator<double>_> *vals,bool negate)

{
  vector<int,_std::allocator<int>_> *this_00;
  double dVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer pHVar5;
  pointer pdVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  
  piVar4 = (this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = &(this->vectorsum).nonzeroinds;
  uVar9 = (ulong)((long)(this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar4) >> 2;
  uVar7 = (uint)uVar9;
  if (0 < (int)uVar7) {
    dVar1 = (this->lprelaxation->mipsolver->options_mip_->super_HighsOptionsStruct).
            small_matrix_value;
    iVar11 = (this->lprelaxation->lpsolver).model_.lp_.num_col_;
    pHVar5 = (this->vectorsum).values.
             super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = (ulong)(uVar7 & 0x7fffffff) + 1;
    do {
      iVar2 = piVar4[uVar10 - 2];
      if ((iVar2 < iVar11) && (ABS(pHVar5[iVar2].hi + pHVar5[iVar2].lo) <= dVar1)) {
        iVar8 = (int)uVar9;
        uVar9 = (ulong)(iVar8 - 1);
        pHVar5[iVar2].hi = 0.0;
        pHVar5[iVar2].lo = 0.0;
        iVar3 = piVar4[(long)iVar8 + -1];
        piVar4[(long)iVar8 + -1] = iVar2;
        piVar4[uVar10 - 2] = iVar3;
      }
      uVar7 = (uint)uVar9;
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
  }
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(int)uVar7);
  std::vector<int,_std::allocator<int>_>::operator=(inds,this_00);
  uVar9 = (ulong)((long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  iVar11 = (int)uVar9;
  std::vector<double,_std::allocator<double>_>::resize(vals,(long)iVar11);
  if (negate) {
    if (iVar11 != 0) {
      piVar4 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      pHVar5 = (this->vectorsum).values.
               super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        iVar11 = piVar4[uVar10];
        pdVar6[uVar10] = -(pHVar5[iVar11].hi + pHVar5[iVar11].lo);
        uVar10 = uVar10 + 1;
      } while ((uVar9 & 0xffffffff) != uVar10);
    }
  }
  else if (iVar11 != 0) {
    piVar4 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pHVar5 = (this->vectorsum).values.
             super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = 0;
    do {
      iVar11 = piVar4[uVar10];
      pdVar6[uVar10] = pHVar5[iVar11].hi + pHVar5[iVar11].lo;
      uVar10 = uVar10 + 1;
    } while ((uVar9 & 0xffffffff) != uVar10);
  }
  return;
}

Assistant:

void HighsLpAggregator::getCurrentAggregation(std::vector<HighsInt>& inds,
                                              std::vector<double>& vals,
                                              bool negate) {
  const double droptol =
      lprelaxation.getMipSolver().options_mip_->small_matrix_value;
  const HighsInt numCol = lprelaxation.numCols();
  vectorsum.cleanup([droptol, numCol](HighsInt col, double val) {
    // only drop values for columns and not for slack variables of rows as the
    // former are the only ones which might be subject to numerical error. The
    // values for row slack variables are exact copies of the weights used
    // (assuming that separators only add each row once). Also all the
    // separators will only allow rows that do have meaningful coefficient
    // contributions with the used weight
    return col < numCol && std::fabs(val) <= droptol;
  });

  inds = vectorsum.getNonzeros();
  HighsInt len = inds.size();
  vals.resize(len);

  if (negate)
    for (HighsInt i = 0; i != len; ++i) vals[i] = -vectorsum.getValue(inds[i]);
  else
    for (HighsInt i = 0; i != len; ++i) vals[i] = vectorsum.getValue(inds[i]);
}